

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSwitch.c
# Opt level: O0

void Aig_CManStoreNum(Aig_CMan_t *p,uint x)

{
  byte *pbVar1;
  uint local_14;
  uint x_local;
  Aig_CMan_t *p_local;
  
  for (local_14 = x; (local_14 & 0xffffff80) != 0; local_14 = local_14 >> 7) {
    pbVar1 = p->pCur;
    p->pCur = pbVar1 + 1;
    *pbVar1 = (byte)local_14 & 0x7f | 0x80;
  }
  pbVar1 = p->pCur;
  p->pCur = pbVar1 + 1;
  *pbVar1 = (byte)local_14;
  if ((long)p->pCur - (long)(p + 1) < (long)(p->nBytes + -10)) {
    return;
  }
  __assert_fail("p->pCur - p->Data < p->nBytes - 10",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigSwitch.c"
                ,0x1b1,"void Aig_CManStoreNum(Aig_CMan_t *, unsigned int)");
}

Assistant:

void Aig_CManStoreNum( Aig_CMan_t * p, unsigned x )
{
    while ( x & ~0x7f )
    {
        *p->pCur++ = (x & 0x7f) | 0x80;
        x >>= 7;
    }
    *p->pCur++ = x;
    assert( p->pCur - p->Data < p->nBytes - 10 );
}